

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w,MissingAction missing_action,double *x_sd,double *x_mean)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar5;
  double in_XMM0_Qa;
  double __value;
  double extraout_XMM0_Qa;
  double __value_00;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double *in_stack_00000008;
  double *in_stack_00000010;
  size_t row;
  longdouble xval;
  longdouble m_prev;
  longdouble s;
  longdouble m;
  longdouble w_this;
  longdouble cnt;
  unsigned_long *puVar6;
  unsigned_long *key;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined6 in_stack_ffffffffffffff22;
  undefined1 local_aa;
  undefined8 local_a0;
  unkbyte10 local_68;
  undefined8 local_10;
  
  local_68 = (longdouble)0;
  local_10 = in_RSI;
  do {
    uVar2 = std::isnan(in_XMM0_Qa);
    in_XMM0_Qa = __value;
    if ((uVar2 & 1) == 0) {
      uVar2 = std::isinf(__value);
      bVar1 = false;
      in_XMM0_Qa = extraout_XMM0_Qa;
      if ((uVar2 & 1) != 0) goto LAB_004c4781;
    }
    else {
LAB_004c4781:
      bVar1 = local_10 <= in_RDX;
    }
    if (!bVar1) {
      for (local_a0 = local_10; local_a0 <= in_RDX; local_a0 = local_a0 + 1) {
        lVar4 = (longdouble)*(float *)(in_RCX + *(long *)(in_RDI + local_a0 * 8) * 4);
        puVar6 = SUB108(lVar4,0);
        uVar7 = (undefined2)((unkuint10)lVar4 >> 0x40);
        key = puVar6;
        uVar8 = uVar7;
        uVar2 = std::isnan(in_XMM0_Qa);
        local_aa = 1;
        lVar4 = in_ST0;
        in_XMM0_Qa = __value_00;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf(__value_00);
          local_aa = (byte)iVar3;
          lVar4 = in_ST0;
          in_XMM0_Qa = extraout_XMM0_Qa_00;
          key = puVar6;
          uVar8 = uVar7;
        }
        in_ST0 = lVar4;
        if (((local_aa ^ 0xff) & 1) != 0) {
          tsl::
          robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                        *)CONCAT62(in_stack_ffffffffffffff22,uVar8),key);
          lVar5 = in_ST3;
          __x_00 = std::fma(__x,in_XMM1_Qa,in_XMM2_Qa);
          in_ST3 = lVar5;
          in_XMM0_Qa = std::fma(__x_00,in_XMM1_Qa,in_XMM2_Qa);
          in_ST0 = in_ST2;
          in_ST2 = lVar5;
          local_68 = lVar4;
        }
      }
      *in_stack_00000010 = (double)local_68;
      std::sqrt(in_XMM0_Qa);
      *in_stack_00000008 = (double)in_ST0;
      return;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}